

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest10::NegativeTest10(NegativeTest10 *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"function_overloading_forbidden_for_subroutines",
             "Check that an overloaded function cannot be declared with subroutine and a program will fail to compile or link if any shader or stage contains two or more  functions with the same name if the name is associated with a subroutine type."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativeTest10_02129ce8;
  this->m_has_test_passed = true;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_po_id = 0;
  this->m_tc_id = 0;
  *(undefined8 *)&this->m_te_id = 0;
  *(undefined8 *)
   ((long)&(this->m_test_cases).
           super__Vector_base<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_test_cases).
           super__Vector_base<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_test_cases).
           super__Vector_base<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

NegativeTest10::NegativeTest10(deqp::Context& context)
	: TestCase(context, "function_overloading_forbidden_for_subroutines",
			   "Check that an overloaded function cannot be declared with subroutine and "
			   "a program will fail to compile or link if any shader or stage contains"
			   " two or more  functions with the same name if the name is associated with"
			   " a subroutine type.")
	, m_has_test_passed(true)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_po_id(0)
	, m_tc_id(0)
	, m_te_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}